

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O2

bool mg::fs::write_file(char *path,string_view *data)

{
  FILE *pFVar1;
  int __fd;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_rschlaikjer[P]mangetsu_src_util_fs_cpp:78:50),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_58;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_rschlaikjer[P]mangetsu_src_util_fs_cpp:78:50),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
  local_31 [8];
  __allocator_type __a2;
  
  __fd = open(path,0x242,0x1a4);
  pFVar1 = _stderr;
  if (__fd == -1) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    bVar7 = false;
    fprintf(pFVar1,"Failed to open \'%s\' - %s\n",path,pcVar5);
  }
  else {
    local_48 = 0;
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    local_58._M_alloc = local_31;
    (local_40._M_pi)->_M_use_count = 1;
    (local_40._M_pi)->_M_weak_count = 1;
    (local_40._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00104d30;
    *(int *)&local_40._M_pi[1]._vptr__Sp_counted_base = __fd;
    local_40._M_pi[1]._M_use_count = 0;
    local_40._M_pi[1]._M_weak_count = 0;
    local_58._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/rschlaikjer[P]mangetsu/src/util/fs.cpp:78:50),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_58);
    uVar6 = data->_M_len;
    uVar8 = 0;
    do {
      sVar3 = write(__fd,data->_M_str + uVar8,uVar6 - uVar8);
      pFVar1 = _stderr;
      iVar2 = (int)sVar3;
      bVar7 = iVar2 != -1;
      if (iVar2 == -1) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar1,"Failed to write \'%s\' - %s\n",path,pcVar5);
        break;
      }
      uVar8 = uVar8 + (long)iVar2;
      uVar6 = data->_M_len;
    } while (uVar8 < uVar6);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  }
  return bVar7;
}

Assistant:

bool write_file(const char *path, const std::string_view &data) {
  // Open file
  const int fd = open(path, O_RDWR | O_CREAT | O_TRUNC, 0644);
  if (fd == -1) {
    fprintf(stderr, "Failed to open '%s' - %s\n", path, strerror(errno));
    return false;
  }
  std::shared_ptr<void> _defer_close_fd(nullptr, [=](...) { close(fd); });

  size_t total_bytes_written = 0;
  do {
    int wrote_bytes = write(fd, &data[total_bytes_written],
                            data.size() - total_bytes_written);
    if (wrote_bytes == -1) {
      fprintf(stderr, "Failed to write '%s' - %s\n", path, strerror(errno));
      return false;
    }
    total_bytes_written += wrote_bytes;
  } while (total_bytes_written < data.size());

  return true;
}